

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

SparseMatrix<double,_1,_int> * __thiscall
Eigen::SparseMatrix<double,1,int>::operator=
          (SparseMatrix<double,1,int> *this,
          SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
          *other)

{
  bool bVar1;
  Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_> *pMVar2;
  SparseMatrix<double,_1,_int> *pSVar3;
  bool needToTranspose;
  SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
  *other_local;
  SparseMatrix<double,_1,_int> *this_local;
  
  bVar1 = SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
          ::isRValue(other);
  if (bVar1) {
    pMVar2 = SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
             ::derived(other);
    initAssignment<Eigen::Map<Eigen::SparseMatrix<double,1313,int>,0,Eigen::Stride<0,0>>>
              (this,pMVar2);
  }
  pMVar2 = SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
           ::derived(other);
  pSVar3 = SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator=
                     ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)this,
                      (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
                       *)pMVar2);
  return pSVar3;
}

Assistant:

EIGEN_DONT_INLINE SparseMatrix<Scalar,_Options,_StorageIndex>& SparseMatrix<Scalar,_Options,_StorageIndex>::operator=(const SparseMatrixBase<OtherDerived>& other)
{
  EIGEN_STATIC_ASSERT((internal::is_same<Scalar, typename OtherDerived::Scalar>::value),
        YOU_MIXED_DIFFERENT_NUMERIC_TYPES__YOU_NEED_TO_USE_THE_CAST_METHOD_OF_MATRIXBASE_TO_CAST_NUMERIC_TYPES_EXPLICITLY)

  #ifdef EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
    EIGEN_SPARSE_CREATE_TEMPORARY_PLUGIN
  #endif
      
  const bool needToTranspose = (Flags & RowMajorBit) != (internal::evaluator<OtherDerived>::Flags & RowMajorBit);
  if (needToTranspose)
  {
    #ifdef EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
      EIGEN_SPARSE_TRANSPOSED_COPY_PLUGIN
    #endif
    // two passes algorithm:
    //  1 - compute the number of coeffs per dest inner vector
    //  2 - do the actual copy/eval
    // Since each coeff of the rhs has to be evaluated twice, let's evaluate it if needed
    typedef typename internal::nested_eval<OtherDerived,2,typename internal::plain_matrix_type<OtherDerived>::type >::type OtherCopy;
    typedef typename internal::remove_all<OtherCopy>::type _OtherCopy;
    typedef internal::evaluator<_OtherCopy> OtherCopyEval;
    OtherCopy otherCopy(other.derived());
    OtherCopyEval otherCopyEval(otherCopy);

    SparseMatrix dest(other.rows(),other.cols());
    Eigen::Map<IndexVector> (dest.m_outerIndex,dest.outerSize()).setZero();

    // pass 1
    // FIXME the above copy could be merged with that pass
    for (Index j=0; j<otherCopy.outerSize(); ++j)
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
        ++dest.m_outerIndex[it.index()];

    // prefix sum
    StorageIndex count = 0;
    IndexVector positions(dest.outerSize());
    for (Index j=0; j<dest.outerSize(); ++j)
    {
      StorageIndex tmp = dest.m_outerIndex[j];
      dest.m_outerIndex[j] = count;
      positions[j] = count;
      count += tmp;
    }
    dest.m_outerIndex[dest.outerSize()] = count;
    // alloc
    dest.m_data.resize(count);
    // pass 2
    for (StorageIndex j=0; j<otherCopy.outerSize(); ++j)
    {
      for (typename OtherCopyEval::InnerIterator it(otherCopyEval, j); it; ++it)
      {
        Index pos = positions[it.index()]++;
        dest.m_data.index(pos) = j;
        dest.m_data.value(pos) = it.value();
      }
    }
    this->swap(dest);
    return *this;
  }
  else
  {
    if(other.isRValue())
    {
      initAssignment(other.derived());
    }
    // there is no special optimization
    return Base::operator=(other.derived());
  }
}